

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O3

CappedArray<char,_26UL> * __thiscall
kj::_::Stringifier::operator*
          (CappedArray<char,_26UL> *__return_storage_ptr__,Stringifier *this,longlong i)

{
  uint8_t *puVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint8_t reverse [25];
  
  reverse[0x10] = '\0';
  reverse[0x11] = '\0';
  reverse[0x12] = '\0';
  reverse[0x13] = '\0';
  reverse[0x14] = '\0';
  reverse[0x15] = '\0';
  reverse[0x16] = '\0';
  reverse[0x17] = '\0';
  reverse[0x18] = '\0';
  reverse[0] = '\0';
  reverse[1] = '\0';
  reverse[2] = '\0';
  reverse[3] = '\0';
  reverse[4] = '\0';
  reverse[5] = '\0';
  reverse[6] = '\0';
  reverse[7] = '\0';
  reverse[8] = '\0';
  reverse[9] = '\0';
  reverse[10] = '\0';
  reverse[0xb] = '\0';
  reverse[0xc] = '\0';
  reverse[0xd] = '\0';
  reverse[0xe] = '\0';
  reverse[0xf] = '\0';
  if (i == 0) {
    puVar5 = reverse + 1;
    pcVar3 = __return_storage_ptr__->content;
  }
  else {
    uVar4 = -i;
    if (0 < i) {
      uVar4 = i;
    }
    puVar5 = reverse;
    do {
      *puVar5 = (char)uVar4 + (char)(uVar4 / 10) * -10;
      puVar5 = puVar5 + 1;
      bVar2 = 9 < uVar4;
      uVar4 = uVar4 / 10;
    } while (bVar2);
    pcVar3 = __return_storage_ptr__->content;
    if (i < 0) {
      pcVar3 = __return_storage_ptr__->content + 1;
      __return_storage_ptr__->content[0] = '-';
    }
    if (puVar5 <= reverse) goto LAB_004abe5e;
  }
  do {
    puVar1 = puVar5 + -1;
    puVar5 = puVar5 + -1;
    *pcVar3 = *puVar1 + '0';
    pcVar3 = pcVar3 + 1;
  } while (reverse < puVar5);
LAB_004abe5e:
  __return_storage_ptr__->currentSize = (long)pcVar3 - (long)__return_storage_ptr__->content;
  return __return_storage_ptr__;
}

Assistant:

static CappedArray<char, sizeof(T) * 3 + 2> stringifyImpl(T i) {
  // We don't use sprintf() because it's not async-signal-safe (for strPreallocated()).
  CappedArray<char, sizeof(T) * 3 + 2> result;
  bool negative = i < 0;
  // Note that if `i` is the most-negative value, negating it produces the same bit value. But
  // since it's a signed integer, this is considered an overflow. We therefore must make it
  // unsigned first, then negate it, to avoid ubsan complaining.
  Unsigned u = i;
  if (negative) u = -u;
  uint8_t reverse[sizeof(T) * 3 + 1]{};
  uint8_t* p = reverse;
  if (u == 0) {
    *p++ = 0;
  } else {
    while (u > 0) {
      *p++ = u % 10;
      u /= 10;
    }
  }

  char* p2 = result.begin();
  if (negative) *p2++ = '-';
  while (p > reverse) {
    *p2++ = '0' + *--p;
  }
  result.setSize(p2 - result.begin());
  return result;
}